

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

int Vec_IntCountNonTrivial(Vec_Ptr_t *vEquivs,int *pnUsed)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  *pnUsed = 0;
  iVar2 = 0;
  for (i = 0; i < vEquivs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vEquivs,i);
    if (1 < *(int *)((long)pvVar1 + 4)) {
      iVar2 = iVar2 + 1;
      *pnUsed = *pnUsed + *(int *)((long)pvVar1 + 4);
    }
  }
  return iVar2;
}

Assistant:

int Vec_IntCountNonTrivial( Vec_Ptr_t * vEquivs, int * pnUsed )
{
    Vec_Int_t * vClass;
    int i, nClasses = 0;
    *pnUsed = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vClass, i )
    {
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        nClasses++;
        (*pnUsed) += Vec_IntSize(vClass);
    }
    return nClasses;
}